

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.hpp
# Opt level: O0

bool xercesc_4_0::XMLString::equals(char *str1,char *str2)

{
  char cVar1;
  char cVar2;
  char *local_20;
  char *str2_local;
  char *str1_local;
  
  if (str1 == str2) {
    str1_local._7_1_ = true;
  }
  else if ((str1 == (char *)0x0) || (local_20 = str2, str2_local = str1, str2 == (char *)0x0)) {
    if (((str1 == (char *)0x0) || (str1_local._7_1_ = false, *str1 == '\0')) &&
       (str1_local._7_1_ = true, str2 != (char *)0x0)) {
      str1_local._7_1_ = *str2 == '\0';
    }
  }
  else {
    do {
      if (*str2_local == '\0') {
        return *local_20 == '\0';
      }
      cVar1 = *str2_local;
      cVar2 = *local_20;
      local_20 = local_20 + 1;
      str2_local = str2_local + 1;
    } while (cVar1 == cVar2);
    str1_local._7_1_ = false;
  }
  return str1_local._7_1_;
}

Assistant:

inline bool XMLString::equals(   const char* str1
                               , const char* str2)
{
    if (str1 == str2)
        return true;

    if (str1 == 0 || str2 == 0)
        return ((!str1 || !*str1) && (!str2 || !*str2));

    while (*str1)
        if(*str1++ != *str2++)  // they are different (or str2 is shorter and we hit the NULL)
            return false;

    // either both ended (and *str2 is 0 too), or str2 is longer
    return (*str2==0);
}